

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<unsigned_long,std::__cxx11::string>
               (ostream *out,char *fmt,unsigned_long *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  FormatList local_40;
  FormatArg local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  code *local_10;
  code *local_8;
  
  local_40.m_formatters = &local_30;
  local_40.m_N = 2;
  local_30.m_formatImpl = detail::FormatArg::formatImpl<unsigned_long>;
  local_30.m_toIntImpl = detail::FormatArg::toIntImpl<unsigned_long>;
  local_10 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_8 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_30.m_value = args;
  local_18 = args_1;
  vformat(out,fmt,&local_40);
  return;
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}